

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::SaveState(FunctionBody *this,ParseNodeFnc *pnodeFnc)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc33,"(!this->IsReparsed())","!this->IsReparsed()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar4 = (pnodeFnc->fncFlags & kFunctionChildCallsEval) << 9;
  uVar1 = *(uint *)&this->field_0x178;
  *(uint *)&this->field_0x178 = uVar1 & 0xff7fffff | uVar4;
  uVar5 = (pnodeFnc->fncFlags & kFunctionCallsEval) << 0x16;
  *(uint *)&this->field_0x178 = uVar1 & 0xfe7fffff | uVar4 | uVar5;
  *(FncFlags *)&this->field_0x178 =
       uVar1 & 0xfc7fffff | uVar4 | uVar5 |
       (pnodeFnc->fncFlags & kFunctionHasReferenceableBuiltInArguments) << 0x14;
  return;
}

Assistant:

void FunctionBody::SaveState(ParseNodeFnc * pnodeFnc)
    {
        Assert(!this->IsReparsed());
        this->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());
        this->SetCallsEval(!!pnodeFnc->CallsEval());
        this->SetHasReferenceableBuiltInArguments(!!pnodeFnc->HasReferenceableBuiltInArguments());
    }